

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall font2svg::glyph::points_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  byte bVar1;
  short sVar2;
  FT_Vector *pFVar3;
  FT_Pos FVar4;
  FT_Pos FVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  allocator<char> local_79;
  ostream *local_78;
  glyph *local_70;
  int local_68;
  int local_64;
  string color;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&color,"",&local_79);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string((string *)&color);
  local_78 = (ostream *)&this->field_0x270;
  std::operator<<(local_78,"\n\n  <!-- draw points as circles -->");
  lVar9 = 0;
  local_70 = this;
  for (lVar8 = 0; sVar2 = (local_70->ftoutline).n_points, lVar8 < sVar2; lVar8 = lVar8 + 1) {
    pFVar3 = local_70->ftpoints;
    uVar7 = (long)((int)lVar8 + 1) % (long)(int)sVar2 & 0xffffffff;
    bVar1 = local_70->tags[uVar7];
    local_64 = *(int *)((long)&pFVar3->x + lVar9);
    local_68 = *(int *)((long)&pFVar3->y + lVar9);
    FVar4 = pFVar3[uVar7].x;
    FVar5 = pFVar3[uVar7].y;
    color._M_string_length = 0;
    color._M_dataplus._M_p = (pointer)&color.field_2;
    color.field_2._M_local_buf[0] = '\0';
    if ((local_70->tags[lVar8] & 1U) == 0) {
      std::__cxx11::string::assign((char *)&color);
      if ((bVar1 & 1) == 0) {
        std::operator<<(local_78,"\n  <!-- halfway pt between 2 ctrl pts -->");
        poVar6 = std::operator<<(local_78,"<circle");
        poVar6 = std::operator<<(poVar6," fill=\'");
        poVar6 = std::operator<<(poVar6,"blue");
        poVar6 = std::operator<<(poVar6,"\'");
        poVar6 = std::operator<<(poVar6," stroke=\'black\'");
        poVar6 = std::operator<<(poVar6," cx=\'");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,((int)FVar4 + local_64) / 2);
        poVar6 = std::operator<<(poVar6,"\' cy=\'");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,((int)FVar5 + local_68) / 2);
        poVar6 = std::operator<<(poVar6,"\'");
        poVar6 = std::operator<<(poVar6," r=\'");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,2);
        poVar6 = std::operator<<(poVar6,"\'");
        std::operator<<(poVar6,"/>");
      }
    }
    else {
      std::__cxx11::string::assign((char *)&color);
    }
    poVar6 = std::operator<<(local_78,"\n  <!--");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar8);
    std::operator<<(poVar6,"-->");
    poVar6 = std::operator<<(local_78,"<circle");
    poVar6 = std::operator<<(poVar6," fill=\'");
    poVar6 = std::operator<<(poVar6,(string *)&color);
    poVar6 = std::operator<<(poVar6,"\'");
    poVar6 = std::operator<<(poVar6," stroke=\'black\'");
    poVar6 = std::operator<<(poVar6," cx=\'");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    poVar6 = std::operator<<(poVar6,"\' cy=\'");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    poVar6 = std::operator<<(poVar6,"\'");
    poVar6 = std::operator<<(poVar6," r=\'");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)(lVar8 == 0) * 5 + 5);
    poVar6 = std::operator<<(poVar6,"\'");
    std::operator<<(poVar6,"/>");
    std::__cxx11::string::~string((string *)&color);
    lVar9 = lVar9 + 0x10;
  }
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string points()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw points as circles -->";
		for ( int i = 0 ; i < ftoutline.n_points ; i++ ) {
			bool this_is_ctrl_pt = !(tags[i] & 1);
			bool next_is_ctrl_pt = !(tags[(i+1)%ftoutline.n_points] & 1);
			int x = ftpoints[i].x;
			int y = ftpoints[i].y;
			int nx = ftpoints[(i+1)%ftoutline.n_points].x;
			int ny = ftpoints[(i+1)%ftoutline.n_points].y;
			int radius = 5;
			if ( i == 0 ) radius = 10;
			std::string color;
			if (this_is_ctrl_pt) color = "none"; else color = "blue";
			if (this_is_ctrl_pt && next_is_ctrl_pt) {
				tmp << "\n  <!-- halfway pt between 2 ctrl pts -->";
				tmp << "<circle"
				  << " fill='" << "blue" << "'"
				  << " stroke='black'"
				  << " cx='" << (x+nx)/2 << "' cy='" << (y+ny)/2 << "'"
				  << " r='" << 2 << "'"
				  << "/>";
			};
			tmp << "\n  <!--" << i << "-->";
			tmp << "<circle"
				<< " fill='" << color << "'"
				<< " stroke='black'"
				<< " cx='" << ftpoints[i].x << "' cy='" << ftpoints[i].y << "'"
				<< " r='" << radius << "'"
				<< "/>";
		}

		return tmp.str();
	}